

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlFetchXMLCatalogFile(xmlCatalogEntryPtr catal)

{
  _xmlCatalogEntry *p_Var1;
  xmlCatalogEntryPtr payload;
  xmlCatalogEntryPtr doc;
  xmlCatalogEntryPtr catal_local;
  
  if (catal == (xmlCatalogEntryPtr)0x0) {
    catal_local._4_4_ = -1;
  }
  else if (catal->URL == (xmlChar *)0x0) {
    catal_local._4_4_ = -1;
  }
  else {
    xmlRMutexLock(&xmlCatalogMutex);
    if (catal->children == (_xmlCatalogEntry *)0x0) {
      if (xmlCatalogXMLFiles != (xmlHashTablePtr)0x0) {
        p_Var1 = (_xmlCatalogEntry *)xmlHashLookup(xmlCatalogXMLFiles,catal->URL);
        if (p_Var1 != (_xmlCatalogEntry *)0x0) {
          if (xmlDebugCatalogs != 0) {
            xmlCatalogPrintDebug("Found %s in file hash\n",catal->URL);
          }
          if (catal->type == XML_CATA_CATALOG) {
            catal->children = p_Var1->children;
          }
          else {
            catal->children = p_Var1;
          }
          catal->dealloc = 0;
          xmlRMutexUnlock(&xmlCatalogMutex);
          return 0;
        }
        if (xmlDebugCatalogs != 0) {
          xmlCatalogPrintDebug("%s not found in file hash\n",catal->URL);
        }
      }
      payload = xmlParseXMLCatalogFile(catal->prefer,catal->URL);
      if (payload == (xmlCatalogEntryPtr)0x0) {
        catal->type = XML_CATA_BROKEN_CATALOG;
        xmlRMutexUnlock(&xmlCatalogMutex);
        catal_local._4_4_ = -1;
      }
      else {
        if (catal->type == XML_CATA_CATALOG) {
          catal->children = payload->children;
        }
        else {
          catal->children = payload;
        }
        payload->dealloc = 1;
        if (xmlCatalogXMLFiles == (xmlHashTablePtr)0x0) {
          xmlCatalogXMLFiles = xmlHashCreate(10);
        }
        if (xmlCatalogXMLFiles != (xmlHashTablePtr)0x0) {
          if (xmlDebugCatalogs != 0) {
            xmlCatalogPrintDebug("%s added to file hash\n",catal->URL);
          }
          xmlHashAddEntry(xmlCatalogXMLFiles,catal->URL,payload);
        }
        xmlRMutexUnlock(&xmlCatalogMutex);
        catal_local._4_4_ = 0;
      }
    }
    else {
      xmlRMutexUnlock(&xmlCatalogMutex);
      catal_local._4_4_ = 0;
    }
  }
  return catal_local._4_4_;
}

Assistant:

static int
xmlFetchXMLCatalogFile(xmlCatalogEntryPtr catal) {
    xmlCatalogEntryPtr doc;

    if (catal == NULL)
	return(-1);
    if (catal->URL == NULL)
	return(-1);

    /*
     * lock the whole catalog for modification
     */
    xmlRMutexLock(&xmlCatalogMutex);
    if (catal->children != NULL) {
	/* Okay someone else did it in the meantime */
	xmlRMutexUnlock(&xmlCatalogMutex);
	return(0);
    }

    if (xmlCatalogXMLFiles != NULL) {
	doc = (xmlCatalogEntryPtr)
	    xmlHashLookup(xmlCatalogXMLFiles, catal->URL);
	if (doc != NULL) {
	    if (xmlDebugCatalogs)
		xmlCatalogPrintDebug(
		    "Found %s in file hash\n", catal->URL);

	    if (catal->type == XML_CATA_CATALOG)
		catal->children = doc->children;
	    else
		catal->children = doc;
	    catal->dealloc = 0;
	    xmlRMutexUnlock(&xmlCatalogMutex);
	    return(0);
	}
	if (xmlDebugCatalogs)
	    xmlCatalogPrintDebug(
		"%s not found in file hash\n", catal->URL);
    }

    /*
     * Fetch and parse. Note that xmlParseXMLCatalogFile does not
     * use the existing catalog, there is no recursion allowed at
     * that level.
     */
    doc = xmlParseXMLCatalogFile(catal->prefer, catal->URL);
    if (doc == NULL) {
	catal->type = XML_CATA_BROKEN_CATALOG;
	xmlRMutexUnlock(&xmlCatalogMutex);
	return(-1);
    }

    if (catal->type == XML_CATA_CATALOG)
	catal->children = doc->children;
    else
	catal->children = doc;

    doc->dealloc = 1;

    if (xmlCatalogXMLFiles == NULL)
	xmlCatalogXMLFiles = xmlHashCreate(10);
    if (xmlCatalogXMLFiles != NULL) {
	if (xmlDebugCatalogs)
	    xmlCatalogPrintDebug(
		"%s added to file hash\n", catal->URL);
	xmlHashAddEntry(xmlCatalogXMLFiles, catal->URL, doc);
    }
    xmlRMutexUnlock(&xmlCatalogMutex);
    return(0);
}